

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float __thiscall
tcu::TextureCubeArrayView::sampleCompare
          (TextureCubeArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float q,
          float lod)

{
  FilterMode FVar1;
  int slice;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int levelNdx;
  int i;
  long lVar6;
  ConstPixelBufferAccess *levels;
  ConstPixelBufferAccess *pCVar7;
  int i_1;
  long lVar8;
  CubeFace face;
  float t_00;
  float fVar9;
  float fVar10;
  float fVar11;
  CubeFaceFloatCoords CVar12;
  ConstPixelBufferAccess faceAccesses1 [6];
  ConstPixelBufferAccess faceAccesses [6];
  ConstPixelBufferAccess local_240;
  undefined1 local_218 [16];
  TextureFormat local_208;
  int aiStack_200 [2];
  TextureFormat local_1f8 [26];
  ConstPixelBufferAccess local_128 [6];
  
  pCVar7 = local_128;
  local_128[0].m_format.type = (ChannelType)t;
  local_128[0].m_format.order = (ChannelOrder)s;
  local_128[0].m_size.m_data[0] = (int)r;
  CVar12 = getCubeFaceCoords((Vec3 *)pCVar7);
  t_00 = CVar12.t;
  fVar11 = CVar12.s;
  slice = selectLayer(this,q);
  face = CVar12.face;
  iVar2 = getCubeArrayFaceIndex(face);
  if (sampler->seamlessCubeMap == true) {
    levels = this->m_levels;
    iVar2 = this->m_numLevels;
    iVar3 = getCubeArrayFaceIndex(face);
    FVar1 = (&sampler->minFilter)[lod <= sampler->lodThreshold];
    if (FVar1 < FILTERMODE_LAST) {
      iVar3 = iVar3 + slice * 6;
      switch(FVar1) {
      case NEAREST:
LAB_007b6509:
        fVar11 = sampleCubeSeamlessNearestCompare(levels,sampler,ref,fVar11,t_00,iVar3);
        return fVar11;
      case LINEAR:
        lVar6 = 0;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)((long)local_128[0].m_size.m_data + lVar6 + -8));
          lVar6 = lVar6 + 0x28;
        } while (lVar6 != 0xf0);
        pCVar7 = local_128;
        for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
          getCubeArrayFaceAccess((ConstPixelBufferAccess *)local_218,levels,0,slice,(CubeFace)lVar6)
          ;
          pCVar7->m_data = (void *)local_1f8[0];
          *(TextureFormat *)((pCVar7->m_size).m_data + 2) = local_208;
          *(int (*) [2])((pCVar7->m_pitch).m_data + 1) = aiStack_200;
          (pCVar7->m_format).order = local_218._0_4_;
          (pCVar7->m_format).type = local_218._4_4_;
          *(undefined8 *)(pCVar7->m_size).m_data = local_218._8_8_;
          pCVar7 = pCVar7 + 1;
        }
        break;
      default:
        iVar2 = iVar2 + -1;
        fVar9 = ceilf(lod + 0.5);
        iVar4 = (int)fVar9 + -1;
        if (iVar4 < iVar2) {
          iVar2 = iVar4;
        }
        iVar5 = 0;
        if (-1 < iVar4) {
          iVar5 = iVar2;
        }
        if (FVar1 != LINEAR_MIPMAP_NEAREST) {
          levels = levels + iVar5;
          goto LAB_007b6509;
        }
        lVar6 = 0;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)((long)local_128[0].m_size.m_data + lVar6 + -8));
          lVar6 = lVar6 + 0x28;
        } while (lVar6 != 0xf0);
        for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
          getCubeArrayFaceAccess
                    ((ConstPixelBufferAccess *)local_218,levels,iVar5,slice,(CubeFace)lVar6);
          pCVar7->m_data = (void *)local_1f8[0];
          *(TextureFormat *)((pCVar7->m_size).m_data + 2) = local_208;
          *(int (*) [2])((pCVar7->m_pitch).m_data + 1) = aiStack_200;
          (pCVar7->m_format).order = local_218._0_4_;
          (pCVar7->m_format).type = local_218._4_4_;
          *(undefined8 *)(pCVar7->m_size).m_data = local_218._8_8_;
          pCVar7 = pCVar7 + 1;
        }
        break;
      case NEAREST_MIPMAP_LINEAR:
      case LINEAR_MIPMAP_LINEAR:
        iVar2 = iVar2 + -1;
        fVar9 = floorf(lod);
        iVar5 = (int)fVar9;
        iVar4 = iVar2;
        if (iVar5 < iVar2) {
          iVar4 = iVar5;
        }
        levelNdx = 0;
        if (-1 < iVar5) {
          levelNdx = iVar4;
        }
        if (levelNdx + 1 <= iVar2) {
          iVar2 = levelNdx + 1;
        }
        if (FVar1 == LINEAR_MIPMAP_LINEAR) {
          lVar6 = 0;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)((long)local_128[0].m_size.m_data + lVar6 + -8));
            lVar6 = lVar6 + 0x28;
          } while (lVar6 != 0xf0);
          lVar6 = 0;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess
                      ((ConstPixelBufferAccess *)(local_218 + lVar6));
            lVar6 = lVar6 + 0x28;
          } while (lVar6 != 0xf0);
          lVar6 = 0;
          for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
            getCubeArrayFaceAccess(&local_240,levels,levelNdx,slice,(CubeFace)lVar8);
            *(void **)((long)(&local_128[0].m_pitch + 1) + lVar6) = local_240.m_data;
            *(undefined8 *)((long)local_128[0].m_size.m_data + lVar6 + 8) = local_240._16_8_;
            *(undefined8 *)((long)local_128[0].m_pitch.m_data + lVar6 + 4) =
                 local_240.m_pitch.m_data._4_8_;
            *(TextureFormat *)((long)local_128[0].m_size.m_data + lVar6 + -8) = local_240.m_format;
            *(undefined8 *)((long)local_128[0].m_size.m_data + lVar6) =
                 local_240.m_size.m_data._0_8_;
            getCubeArrayFaceAccess(&local_240,levels,iVar2,slice,(CubeFace)lVar8);
            *(void **)((long)&local_1f8[0].order + lVar6) = local_240.m_data;
            *(undefined8 *)((long)&local_208.order + lVar6) = local_240._16_8_;
            *(undefined8 *)((long)&local_1f8[-1].order + lVar6) = local_240.m_pitch.m_data._4_8_;
            *(TextureFormat *)(local_218 + lVar6) = local_240.m_format;
            *(undefined8 *)(local_218 + lVar6 + 8) = local_240.m_size.m_data._0_8_;
            lVar6 = lVar6 + 0x28;
          }
          fVar10 = sampleCubeSeamlessLinearCompare(&local_128,face,sampler,ref,fVar11,t_00);
          fVar11 = sampleCubeSeamlessLinearCompare
                             ((ConstPixelBufferAccess (*) [6])local_218,face,sampler,ref,fVar11,t_00
                             );
        }
        else {
          fVar10 = sampleCubeSeamlessNearestCompare(levels + levelNdx,sampler,ref,fVar11,t_00,iVar3)
          ;
          fVar11 = sampleCubeSeamlessNearestCompare(levels + iVar2,sampler,ref,fVar11,t_00,iVar3);
        }
        return fVar11 * (lod - fVar9) + (1.0 - (lod - fVar9)) * fVar10;
      }
      fVar11 = sampleCubeSeamlessLinearCompare(&local_128,face,sampler,ref,fVar11,t_00);
    }
    else {
      fVar11 = 0.0;
    }
  }
  else {
    local_128[0].m_size.m_data[0] = slice * 6 + iVar2;
    local_128[0].m_format.order = R;
    local_128[0].m_format.type = SNORM_INT8;
    fVar11 = sampleLevelArray2DCompare
                       (this->m_levels,this->m_numLevels,sampler,ref,fVar11,t_00,lod,
                        (IVec3 *)local_128);
  }
  return fVar11;
}

Assistant:

float TextureCubeArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float r, float q, float lod) const
{
	const CubeFaceFloatCoords	coords		= getCubeFaceCoords(Vec3(s, t, r));
	const int					layer		= selectLayer(q);
	const int					faceDepth	= (layer * 6) + getCubeArrayFaceIndex(coords.face);

	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);

	if (sampler.seamlessCubeMap)
		return sampleCubeArraySeamlessCompare(m_levels, m_numLevels, layer, coords.face, sampler, ref, coords.s, coords.t, lod);
	else
		return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, coords.s, coords.t, lod, IVec3(0, 0, faceDepth));
}